

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * ImageCopy(Image image)

{
  int iVar1;
  int height;
  void *__dest;
  Image *in_RDI;
  int iVar2;
  int iVar3;
  int width;
  bool bVar4;
  
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  iVar3 = 0;
  width = image.width;
  height = image.height;
  iVar2 = 0;
  if (0 < image.mipmaps) {
    iVar2 = image.mipmaps;
  }
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    iVar1 = GetPixelDataSize(width,height,image.format);
    iVar3 = iVar3 + iVar1;
    width = width / 2;
    height = height / 2;
    if (width < 2) {
      width = 1;
    }
    if (height < 2) {
      height = 1;
    }
  }
  __dest = malloc((long)iVar3);
  in_RDI->data = __dest;
  if (__dest != (void *)0x0) {
    memcpy(__dest,image.data,(long)iVar3);
    in_RDI->width = image.width;
    in_RDI->height = image.height;
    in_RDI->mipmaps = image.mipmaps;
    in_RDI->format = image.format;
  }
  return in_RDI;
}

Assistant:

Image ImageCopy(Image image)
{
    Image newImage = { 0 };

    int width = image.width;
    int height = image.height;
    int size = 0;

    for (int i = 0; i < image.mipmaps; i++)
    {
        size += GetPixelDataSize(width, height, image.format);

        width /= 2;
        height /= 2;

        // Security check for NPOT textures
        if (width < 1) width = 1;
        if (height < 1) height = 1;
    }

    newImage.data = RL_MALLOC(size);

    if (newImage.data != NULL)
    {
        // NOTE: Size must be provided in bytes
        memcpy(newImage.data, image.data, size);

        newImage.width = image.width;
        newImage.height = image.height;
        newImage.mipmaps = image.mipmaps;
        newImage.format = image.format;
    }

    return newImage;
}